

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O1

int mbedtls_dhm_set_group(mbedtls_dhm_context *ctx,mbedtls_mpi *P,mbedtls_mpi *G)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = mbedtls_mpi_copy(&ctx->P,P);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_copy(&ctx->G,G), iVar1 == 0)) {
    sVar2 = mbedtls_mpi_size(&ctx->P);
    ctx->len = sVar2;
    return 0;
  }
  return iVar1 + -0x3580;
}

Assistant:

int mbedtls_dhm_set_group( mbedtls_dhm_context *ctx,
                           const mbedtls_mpi *P,
                           const mbedtls_mpi *G )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    DHM_VALIDATE_RET( ctx != NULL );
    DHM_VALIDATE_RET( P != NULL );
    DHM_VALIDATE_RET( G != NULL );

    if( ( ret = mbedtls_mpi_copy( &ctx->P, P ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &ctx->G, G ) ) != 0 )
    {
        return( MBEDTLS_ERR_DHM_SET_GROUP_FAILED + ret );
    }

    ctx->len = mbedtls_mpi_size( &ctx->P );
    return( 0 );
}